

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_dotted_line_start(size_t maxwidth,char *startwith)

{
  size_t local_130;
  size_t line_len;
  size_t len;
  char line [256];
  char *startwith_local;
  size_t maxwidth_local;
  
  line_len = 0;
  line._248_8_ = startwith;
  memset(&len,0x2e,maxwidth);
  line_len = strlen((char *)line._248_8_);
  local_130 = line_len;
  if (maxwidth - 1 < line_len) {
    local_130 = maxwidth - 1;
  }
  memcpy(&len,(void *)line._248_8_,local_130);
  if (line_len < maxwidth - 1) {
    line[line_len - 8] = ' ';
  }
  *(undefined1 *)((long)&line_len + maxwidth + 7) = 0;
  fputs((char *)&len,_stdout);
  return;
}

Assistant:

static void
fct_dotted_line_start(size_t maxwidth, char const *startwith)
{
    char line[FCT_DOTTED_MAX_LEN];
    size_t len =0;
    size_t line_len =0;

    memset(line, '.', sizeof(char)*maxwidth);
    len = strlen(startwith);
    line_len = FCTMIN(maxwidth-1, len);
    memcpy(line, startwith, sizeof(char)*line_len);
    if ( len < maxwidth-1)
    {
        line[len] = ' ';
    }
    line[maxwidth-1] = '\0';
    fputs(line, stdout);
}